

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O3

ParquetColumnDefinition *
duckdb::ParquetColumnDefinition::Deserialize
          (ParquetColumnDefinition *__return_storage_ptr__,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  Value local_c8;
  LogicalType local_88;
  Value local_70;
  
  ParquetColumnDefinition(__return_storage_ptr__);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"field_id");
  iVar5 = 0;
  if ((char)uVar4 != '\0') {
    iVar5 = (*deserializer->_vptr_Deserializer[0x12])(deserializer);
  }
  __return_storage_ptr__->field_id = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"name");
  if ((char)uVar4 == '\0') {
    puVar3 = &local_c8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_c8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
         0xffffffffffffff00;
    local_c8.type_._0_8_ = puVar3;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_c8);
    if ((undefined8 *)local_c8.type_._0_8_ == puVar3) goto LAB_0109200b;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_c8,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_c8);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c8.type_._0_8_ ==
        &local_c8.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    goto LAB_0109200b;
  }
  operator_delete((void *)local_c8.type_._0_8_);
LAB_0109200b:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_c8.type_,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (__return_storage_ptr__->type).id_ = local_c8.type_.id_;
  (__return_storage_ptr__->type).physical_type_ = local_c8.type_.physical_type_;
  peVar1 = (__return_storage_ptr__->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (__return_storage_ptr__->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_c8.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_c8.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_c8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_c8.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_c8.type_);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x68,"default_value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_c8,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&__return_storage_ptr__->default_value,&local_c8);
  Value::~Value(&local_c8);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_70,&local_88);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"identifier");
  if ((char)uVar4 == '\0') {
    Value::operator=(&__return_storage_ptr__->identifier,&local_70);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Value::Deserialize(&local_c8,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    Value::operator=(&__return_storage_ptr__->identifier,&local_c8);
    Value::~Value(&local_c8);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  Value::~Value(&local_70);
  LogicalType::~LogicalType(&local_88);
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnDefinition ParquetColumnDefinition::Deserialize(Deserializer &deserializer) {
	ParquetColumnDefinition result;
	deserializer.ReadPropertyWithDefault<int32_t>(100, "field_id", result.field_id);
	deserializer.ReadPropertyWithDefault<string>(101, "name", result.name);
	deserializer.ReadProperty<LogicalType>(103, "type", result.type);
	deserializer.ReadProperty<Value>(104, "default_value", result.default_value);
	deserializer.ReadPropertyWithExplicitDefault<Value>(105, "identifier", result.identifier, Value());
	return result;
}